

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::MeasuredMaterial::ToString_abi_cxx11_(string *__return_storage_ptr__,MeasuredMaterial *this)

{
  FloatTextureHandle *in_RCX;
  
  StringPrintf<pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ MeasuredMaterial displacement: %s ]",(char *)this,
             in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string MeasuredMaterial::ToString() const {
    return StringPrintf("[ MeasuredMaterial displacement: %s ]", displacement);
}